

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-sockets.c
# Opt level: O3

int lws_plat_ifname_to_hwaddr(int fd,char *ifname,uint8_t *hwaddr,int len)

{
  int iVar1;
  ifreq i;
  char local_48 [18];
  undefined4 uStack_36;
  undefined2 uStack_32;
  undefined8 uStack_30;
  undefined8 local_28;
  
  stack0xffffffffffffffc8 = 0;
  uStack_30 = 0;
  local_48[0] = '\0';
  local_48[1] = '\0';
  local_48[2] = '\0';
  local_48[3] = '\0';
  local_48[4] = '\0';
  local_48[5] = '\0';
  local_48[6] = '\0';
  local_48[7] = '\0';
  local_48[8] = '\0';
  local_48[9] = '\0';
  local_48[10] = '\0';
  local_48[0xb] = '\0';
  local_48[0xc] = '\0';
  local_48[0xd] = '\0';
  local_48[0xe] = '\0';
  local_48[0xf] = '\0';
  local_28 = 0;
  lws_strncpy(local_48,ifname,0x10);
  iVar1 = ioctl(fd,0x8927,local_48);
  if (iVar1 < 0) {
    iVar1 = -1;
  }
  else {
    *(undefined2 *)(hwaddr + 4) = uStack_32;
    *(undefined4 *)hwaddr = uStack_36;
    iVar1 = 6;
  }
  return iVar1;
}

Assistant:

int
lws_plat_ifname_to_hwaddr(int fd, const char *ifname, uint8_t *hwaddr, int len)
{
#if defined(__linux__)
	struct ifreq i;

	memset(&i, 0, sizeof(i));
	lws_strncpy(i.ifr_name, ifname, sizeof(i.ifr_name));

	if (ioctl(fd, SIOCGIFHWADDR, &i) < 0)
		return -1;

	memcpy(hwaddr, &i.ifr_hwaddr.sa_data, 6);

	return 6;
#else
	lwsl_err("%s: UNIMPLEMENTED on this platform\n", __func__);

	return -1;
#endif
}